

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O2

int mk_utils_worker_spawn(_func_void_void_ptr *func,void *arg,pthread_t *tid)

{
  uint __errnum;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  int iVar4;
  pthread_attr_t thread_attr;
  char local_a8 [128];
  
  pthread_attr_init((pthread_attr_t *)&thread_attr);
  iVar4 = 0;
  pthread_attr_setdetachstate((pthread_attr_t *)&thread_attr,0);
  iVar1 = pthread_create(tid,(pthread_attr_t *)&thread_attr,(__start_routine *)func,arg);
  if (iVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror_r(__errnum,local_a8,0x80);
    if (pcVar3 != (char *)0x0) {
      mk_print(0x1001,"strerror_r() failed");
    }
    mk_print(0x1001,"%s: %s, errno=%i at %s:%i","pthread_create",local_a8,(ulong)__errnum,
             "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_core/mk_utils.c",
             0x11d);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int mk_utils_worker_spawn(void (*func) (void *), void *arg, pthread_t *tid)
{
    pthread_attr_t thread_attr;

    pthread_attr_init(&thread_attr);
    pthread_attr_setdetachstate(&thread_attr, PTHREAD_CREATE_JOINABLE);
    if (pthread_create(tid, &thread_attr, (void *) func, arg) < 0) {
        mk_libc_error("pthread_create");
        return -1;
    }

    return 0;
}